

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

char __thiscall duckdb::Linenoise::Search(Linenoise *this,char c)

{
  int iVar1;
  EscapeSequence EVar2;
  char cVar3;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  switch(iVar1) {
  case 1:
switchD_001efbfd_caseD_1:
    AcceptSearch(this,'\x01');
    return '\x01';
  case 2:
switchD_001efbfd_caseD_2:
    AcceptSearch(this,'\x02');
    return '\x02';
  case 3:
  case 7:
    CancelSearch(this);
    return '\0';
  case 4:
    AcceptSearch(this,'\x04');
    cVar3 = '\x04';
    break;
  case 5:
  case 9:
switchD_001efbfd_caseD_5:
    AcceptSearch(this,'\x05');
    cVar3 = '\x05';
    break;
  case 6:
switchD_001efbfd_caseD_6:
    AcceptSearch(this,'\x06');
    cVar3 = '\x06';
    break;
  case 10:
  case 0xd:
    AcceptSearch(this,'\r');
    cVar3 = '\r';
    break;
  case 0xb:
    AcceptSearch(this,'\v');
    cVar3 = '\v';
    break;
  case 0xc:
    linenoiseClearScreen();
    goto switchD_001efcb4_caseD_a;
  case 0xe:
  case 0x12:
  case 0x13:
switchD_001efbfd_caseD_e:
    SearchNext(this);
    goto switchD_001efcb4_caseD_a;
  case 0xf:
  case 0x11:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
switchD_001efbfd_caseD_f:
    ::std::__cxx11::string::push_back((char)this + 'h');
    goto LAB_001efc66;
  case 0x10:
switchD_001efbfd_caseD_10:
    SearchPrev(this);
    goto switchD_001efcb4_caseD_a;
  case 0x14:
    AcceptSearch(this,'\x14');
    cVar3 = '\x14';
    break;
  case 0x15:
    AcceptSearch(this,'\x15');
    cVar3 = '\x15';
    break;
  case 0x1b:
    EVar2 = Terminal::ReadEscapeSequence(this->ifd);
    switch(EVar2) {
    case HOME:
      goto switchD_001efbfd_caseD_1;
    case END:
      goto switchD_001efbfd_caseD_5;
    case UP:
      goto switchD_001efbfd_caseD_10;
    case DOWN:
      goto switchD_001efbfd_caseD_e;
    case RIGHT:
      goto switchD_001efbfd_caseD_6;
    case LEFT:
      goto switchD_001efbfd_caseD_2;
    default:
      goto switchD_001efcb4_caseD_a;
    case ESCAPE:
      AcceptSearch(this,'\0');
      return '\0';
    }
  default:
    if (iVar1 != 0x7f) goto switchD_001efbfd_caseD_f;
  case 8:
  case 0x17:
    if ((this->search_buf)._M_string_length != 0) {
      ::std::__cxx11::string::pop_back();
    }
LAB_001efc66:
    PerformSearch(this);
switchD_001efcb4_caseD_a:
    RefreshSearch(this);
    return '\0';
  }
  return cVar3;
}

Assistant:

char Linenoise::Search(char c) {
	switch (c) {
	case CTRL_J:
	case ENTER: /* enter */
		// accept search and run
		return AcceptSearch(ENTER);
	case CTRL_R:
	case CTRL_S:
		// move to the next match index
		SearchNext();
		break;
	case ESC: /* escape sequence */ {
		auto escape = Terminal::ReadEscapeSequence(ifd);
		switch (escape) {
		case EscapeSequence::ESCAPE:
			// double escape accepts search without any additional command
			return AcceptSearch(0);
		case EscapeSequence::UP:
			SearchPrev();
			break;
		case EscapeSequence::DOWN:
			SearchNext();
			break;
		case EscapeSequence::HOME:
			return AcceptSearch(CTRL_A);
		case EscapeSequence::END:
			return AcceptSearch(CTRL_E);
		case EscapeSequence::LEFT:
			return AcceptSearch(CTRL_B);
		case EscapeSequence::RIGHT:
			return AcceptSearch(CTRL_F);
		default:
			break;
		}
		break;
	}
	case CTRL_A: // accept search, move to start of line
		return AcceptSearch(CTRL_A);
	case '\t':
	case CTRL_E: // accept search - move to end of line
		return AcceptSearch(CTRL_E);
	case CTRL_B: // accept search - move cursor left
		return AcceptSearch(CTRL_B);
	case CTRL_F: // accept search - move cursor right
		return AcceptSearch(CTRL_F);
	case CTRL_T: // accept search: swap character
		return AcceptSearch(CTRL_T);
	case CTRL_U: // accept search, clear buffer
		return AcceptSearch(CTRL_U);
	case CTRL_K: // accept search, clear after cursor
		return AcceptSearch(CTRL_K);
	case CTRL_D: // accept search, delete a character
		return AcceptSearch(CTRL_D);
	case CTRL_L:
		linenoiseClearScreen();
		break;
	case CTRL_P:
		SearchPrev();
		break;
	case CTRL_N:
		SearchNext();
		break;
	case CTRL_C:
	case CTRL_G:
		// abort search
		CancelSearch();
		return 0;
	case BACKSPACE: /* backspace */
	case CTRL_H:    /* ctrl-h */
	case CTRL_W:    /* ctrl-w */
		// remove trailing UTF-8 bytes (if any)
		while (!search_buf.empty() && ((search_buf.back() & 0xc0) == 0x80)) {
			search_buf.pop_back();
		}
		// finally remove the first UTF-8 byte
		if (!search_buf.empty()) {
			search_buf.pop_back();
		}
		PerformSearch();
		break;
	default:
		// add input to search buffer
		search_buf += c;
		// perform the search
		PerformSearch();
		break;
	}
	RefreshSearch();
	return 0;
}